

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

matches * atomtab(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  code *pcVar1;
  matches *a_00;
  matches *b;
  long lVar2;
  uint *puVar3;
  match *pmVar4;
  undefined8 *puVar5;
  byte bVar6;
  match in_stack_fffffffffffffe58;
  match sm;
  
  bVar6 = 0;
  if (ctx->reverse == 0) {
    for (; (((*(ulong *)((long)v + 8) & *a) != *v ||
            (((uint)*(ulong *)((long)v + 0x110) != 0 &&
             ((ctx->vartype & (uint)*(ulong *)((long)v + 0x110)) == 0)))) ||
           ((*(uint *)((long)v + 0x114) != 0 && ((ctx->ptype & *(uint *)((long)v + 0x114)) == 0))));
        v = (void *)((long)v + 0x118)) {
    }
    *m = *m | *(ulong *)((long)v + 8);
    a_00 = (matches *)0x0;
    for (lVar2 = 0x18; lVar2 != 0x118; lVar2 = lVar2 + 0x10) {
      pcVar1 = *(code **)((long)v + lVar2 + -8);
      if (pcVar1 != (code *)0x0) {
        (*pcVar1)(ctx,a,m,*(undefined8 *)((long)v + lVar2),0);
      }
    }
  }
  else {
    a_00 = emptymatches();
    puVar3 = (uint *)((long)v + 0x114);
    while( true ) {
      if (((puVar3[-1] == 0) || ((ctx->vartype & puVar3[-1]) != 0)) &&
         ((*puVar3 == 0 || ((ctx->ptype & *puVar3) != 0)))) {
        memset(&sm,0,0xb8);
        sm.a[0] = *(ull *)(puVar3 + -0x45);
        sm.m[0] = *(ull *)(puVar3 + -0x43);
        sm.lpos = spos;
        pmVar4 = &sm;
        puVar5 = (undefined8 *)&stack0xfffffffffffffe58;
        for (lVar2 = 0x17; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar5 = *(undefined8 *)pmVar4;
          pmVar4 = (match *)((long)pmVar4 + (ulong)bVar6 * -0x10 + 8);
          puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
        }
        b = tabdesc(ctx,in_stack_fffffffffffffe58,(atom *)(puVar3 + -0x41));
        if (b != (matches *)0x0) {
          catmatches(a_00,b);
        }
      }
      if (((*(long *)(puVar3 + -0x43) == 0) && (puVar3[-1] == 0)) && (*puVar3 == 0)) break;
      puVar3 = puVar3 + 0x46;
    }
  }
  return a_00;
}

Assistant:

struct matches *atomtab APROTO {
	const struct insn *tab = v;
	if (!ctx->reverse) {
		int i;
		while ((a[0]&tab->mask) != tab->val || (tab->vartype && !(tab->vartype & ctx->vartype)) || (tab->ptype && !(tab->ptype & ctx->ptype)))
			tab++;
		m[0] |= tab->mask;
		for (i = 0; i < 16; i++)
			if (tab->atoms[i].fun)
				tab->atoms[i].fun (ctx, a, m, tab->atoms[i].arg, 0);
		return NULL;
	} else {
		struct matches *res = emptymatches();
		int i;
		for (i = 0; ; i++) {
			if ((!tab[i].vartype || tab[i].vartype & ctx->vartype) && (!tab[i].ptype || tab[i].ptype & ctx->ptype)) {
				struct match sm = { 0, .a = {tab[i].val}, .m = {tab[i].mask}, .lpos = spos };
				struct matches *subm = tabdesc(ctx, sm, tab[i].atoms); 
				if (subm)
					res = catmatches(res, subm);
			}
			if (!tab[i].mask && !tab[i].vartype && !tab[i].ptype) break;
		}
		return res;
	}
}